

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather_test.c
# Opt level: O0

REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,char *filename,REF_INT version)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL param [2];
  REF_INT node;
  REF_INT id;
  REF_INT type;
  REF_INT nodes [27];
  REF_INT cell;
  REF_GEOM ref_geom;
  REF_GRID_conflict ref_grid;
  char *pcStack_20;
  REF_INT version_local;
  char *filename_local;
  REF_MPI ref_mpi_local;
  
  if (ref_mpi->id == 0) {
    ref_grid._4_4_ = version;
    pcStack_20 = filename;
    filename_local = (char *)ref_mpi;
    uVar1 = ref_fixture_tet_brick_grid((REF_GRID *)&ref_geom,ref_mpi);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x37,"ref_gather_meshb_fixture",(ulong)uVar1,"set up tet");
      return uVar1;
    }
    *(REF_INT *)((long)&ref_geom->e2f + 4) = ref_grid._4_4_;
    unique0x00012000 = (REF_GEOM)ref_geom->body;
    id = 0;
    type = 1;
    nodes[0] = 0xf;
    uVar1 = ref_cell_add((REF_CELL)ref_geom->descr,&id,nodes + 0x19);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x3d,"ref_gather_meshb_fixture",(ulong)uVar1,"add edge");
      return uVar1;
    }
    param[1]._4_4_ = 0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,0,0,1,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x41,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom node");
      return uVar1;
    }
    param[1]._4_4_ = 1;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,1,0,2,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x44,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom node");
      return uVar1;
    }
    param[1]._4_4_ = 0;
    _ref_private_macro_code_rss_1 = 10.0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,0,1,0xf,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x49,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom edge");
      return uVar1;
    }
    param[1]._4_4_ = 1;
    _ref_private_macro_code_rss_1 = 20.0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,1,1,0xf,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x4d,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom edge");
      return uVar1;
    }
    param[1]._4_4_ = 0;
    _ref_private_macro_code_rss_1 = 10.0;
    param[0] = 20.0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,0,2,3,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x53,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    param[1]._4_4_ = 1;
    _ref_private_macro_code_rss_1 = 11.0;
    param[0] = 20.0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,1,2,3,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x59,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    param[1]._4_4_ = 2;
    _ref_private_macro_code_rss_1 = 10.5;
    param[0] = 21.0;
    uVar1 = ref_geom_add(stack0xffffffffffffffc8,2,2,3,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x5f,"ref_gather_meshb_fixture",(ulong)uVar1,"add geom face");
      return uVar1;
    }
    uVar1 = ref_export_by_extension((REF_GRID)ref_geom,pcStack_20);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x61,"ref_gather_meshb_fixture",(ulong)uVar1,"export");
      return uVar1;
    }
    uVar1 = ref_grid_free((REF_GRID)ref_geom);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather_test.c"
             ,0x62,"ref_gather_meshb_fixture",(ulong)uVar1,"free");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_fixture(REF_MPI ref_mpi,
                                                   const char *filename,
                                                   REF_INT version) {
  REF_GRID ref_grid;
  REF_GEOM ref_geom;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT type, id, node;
  REF_DBL param[2];

  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_fixture_tet_brick_grid(&ref_grid, ref_mpi), "set up tet");
    ref_grid_meshb_version(ref_grid) = version;
    ref_geom = ref_grid_geom(ref_grid);
    nodes[0] = 0;
    nodes[1] = 1;
    nodes[2] = 15;
    RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &cell), "add edge");
    type = REF_GEOM_NODE;
    id = 1;
    node = 0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    id = 2;
    node = 1;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom node");
    type = REF_GEOM_EDGE;
    id = 15;
    node = 0;
    param[0] = 10.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    id = 15;
    node = 1;
    param[0] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom edge");
    type = REF_GEOM_FACE;
    id = 3;
    node = 0;
    param[0] = 10.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 1;
    param[0] = 11.0;
    param[1] = 20.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");
    type = REF_GEOM_FACE;
    id = 3;
    node = 2;
    param[0] = 10.5;
    param[1] = 21.0;
    RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom face");

    RSS(ref_export_by_extension(ref_grid, filename), "export");
    RSS(ref_grid_free(ref_grid), "free");
  }
  return REF_SUCCESS;
}